

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall
RegisterDyndepParserTestOutDuplicateThroughOther::RegisterDyndepParserTestOutDuplicateThroughOther
          (RegisterDyndepParserTestOutDuplicateThroughOther *this)

{
  RegisterTest(DyndepParserTestOutDuplicateThroughOther::Create,
               "DyndepParserTest.OutDuplicateThroughOther");
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutDuplicateThroughOther) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"build otherout: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:3: multiple statements for 'otherout'\n"
            "build otherout: dyndep\n"
            "              ^ near here", err);
}